

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_InitUndeclLocalLetProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  PropertyId propertyId;
  
  propertyId = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  JavascriptOperators::OP_InitLetProperty
            (*(Var *)(this + 0x58),propertyId,
             *(Var *)(*(long *)(*(long *)(this + 0x78) + 8) + 0x4f8));
  return;
}

Assistant:

void InterpreterStackFrame::OP_InitUndeclLocalLetProperty(unaligned T* playout)
    {
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        JavascriptOperators::OP_InitLetProperty(this->localClosure, propertyId, this->scriptContext->GetLibrary()->GetUndeclBlockVar());
    }